

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chset.hpp
# Opt level: O1

void __thiscall
boost::xpressive::detail::
compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>::
set_char(compound_charset<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>_>
         *this,char_type ch,regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *tr,
        bool icase)

{
  ulong *puVar1;
  ctype<char> *pcVar2;
  byte bVar3;
  undefined7 in_register_00000009;
  
  if ((int)CONCAT71(in_register_00000009,icase) == 0) {
    puVar1 = (ulong *)((long)(this->super_basic_chset<char>).super_basic_chset_8bit<char>.bset_.
                             super__Base_bitset<4UL>._M_w + (ulong)((byte)ch >> 3 & 0x18));
    *puVar1 = *puVar1 | 1L << (ch & 0x3fU);
  }
  else {
    pcVar2 = (tr->super_cpp_regex_traits<char>).ctype_;
    bVar3 = (**(code **)(*(long *)pcVar2 + 0x20))(pcVar2,(int)ch);
    puVar1 = (ulong *)((long)(this->super_basic_chset<char>).super_basic_chset_8bit<char>.bset_.
                             super__Base_bitset<4UL>._M_w + (ulong)(bVar3 >> 3 & 0x18));
    *puVar1 = *puVar1 | 1L << (bVar3 & 0x3f);
  }
  return;
}

Assistant:

void set_char(char_type ch, Traits const &tr, bool icase)
    {
        icase ? this->base_type::set(ch, tr) : this->base_type::set(ch);
    }